

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall
iqxmlrpc::anon_unknown_7::StructBuilder::do_visit_element(StructBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *pVVar2;
  XML_RPC_violation *this_00;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_b8
  ;
  string local_a0;
  byte local_7d;
  byte local_6a;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_41;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_40
  ;
  string local_38;
  string *local_18;
  string *tagname_local;
  StructBuilder *this_local;
  
  local_18 = tagname;
  tagname_local = (string *)this;
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      Parser::get_data_abi_cxx11_
                (&local_38,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
      std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    else {
      if (iVar1 != 3) {
        this_00 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
        Parser::context_abi_cxx11_
                  (&local_a0,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
        XML_RPC_violation::XML_RPC_violation(this_00,&local_a0);
        __cxa_throw(this_00,&XML_RPC_violation::typeinfo,XML_RPC_violation::~XML_RPC_violation);
      }
      pVVar2 = BuilderBase::sub_build<iqxmlrpc::Value_type*,iqxmlrpc::ValueBuilder>
                         ((BuilderBase *)this,false);
      this->value_ = pVVar2;
      local_41 = 0;
      local_6a = 0;
      local_7d = 0;
      if (this->value_ == (Value_type *)0x0) {
        local_b8 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x28);
        local_41 = 1;
        local_40 = local_b8;
        std::allocator<char>::allocator();
        local_6a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
        local_7d = 1;
        Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        Scalar(local_b8,&local_68);
      }
      else {
        local_b8 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this->value_;
      }
      local_41 = 0;
      this->value_ = &local_b8->super_Value_type;
      if ((local_7d & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_68);
      }
      if ((local_6a & 1) != 0) {
        std::allocator<char>::~allocator(&local_69);
      }
    }
  }
  return;
}

Assistant:

virtual void
  do_visit_element(const std::string& tagname)
  {
    switch (state_.change(tagname)) {
    case NAME_READ:
      name_ = parser_.get_data();
      break;

    case VALUE_READ:
      value_ = sub_build<Value_type*, ValueBuilder>();
      value_ = value_ ? value_ : new String("");
      break;

    case MEMBER:
      break;

    default:
      throw XML_RPC_violation(parser_.context());
    }
  }